

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

void __thiscall DriverTest_Glob_Test::TestBody(DriverTest_Glob_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  byte bVar1;
  bool bVar2;
  ParamType *pPVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_cb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a80;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9fc;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_9fb;
  undefined1 local_9fa;
  allocator local_9f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  iterator local_9d0;
  size_type local_9c8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9c0;
  allocator local_989;
  string local_988;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_964;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_963;
  undefined1 local_962;
  allocator local_961;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  iterator local_938;
  size_type local_930;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_928;
  allocator local_8f1;
  string local_8f0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8cc;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_8cb;
  undefined1 local_8ca;
  allocator local_8c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  iterator local_8a0;
  size_type local_898;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_890;
  allocator local_859;
  string local_858;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_835;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_834;
  undefined1 local_833;
  allocator local_832;
  allocator local_831;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  string local_808 [32];
  iterator local_7e8;
  size_type local_7e0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7d8;
  allocator local_7a1;
  string local_7a0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_77f;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_77e;
  undefined1 local_77d;
  allocator local_77c;
  allocator local_77b;
  allocator local_77a;
  allocator local_779;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  iterator local_6f0;
  size_type local_6e8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6e0;
  allocator local_6a9;
  string local_6a8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_681;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_680;
  undefined1 local_67f;
  allocator local_67e;
  allocator local_67d;
  allocator local_67c;
  allocator local_67b;
  allocator local_67a;
  allocator local_679;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  iterator local_5b0;
  size_type local_5a8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5a0;
  allocator local_569;
  string local_568;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_545;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_544;
  undefined1 local_543;
  allocator local_542;
  allocator local_541;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  string local_518 [32];
  iterator local_4f8;
  size_type local_4f0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e8;
  allocator local_4b1;
  string local_4b0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48d;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_48c;
  undefined1 local_48b;
  allocator local_48a;
  allocator local_489;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  string local_460 [32];
  iterator local_440;
  size_type local_438;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_430;
  allocator local_3f9;
  string local_3f8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d5;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_3d4;
  undefined1 local_3d3;
  allocator local_3d2;
  allocator local_3d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  string local_3a8 [32];
  iterator local_388;
  size_type local_380;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  allocator local_341;
  string local_340;
  undefined1 local_320 [8];
  anon_class_16_2_6acbd76d check;
  anon_class_40_2_d7075ad8 resolve;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  allocator local_291;
  string local_290;
  allocator local_269;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8 [32];
  undefined1 local_198 [8];
  anon_class_40_2_d7075ad8 put;
  string local_168 [32];
  undefined1 local_148 [8];
  string type;
  string local_120 [32];
  string local_100 [32];
  string root;
  string local_b0 [8];
  string rawRoot;
  Arbiter a;
  DriverTest_Glob_Test *this_local;
  
  arbiter::Arbiter::Arbiter((Arbiter *)(rawRoot.field_2._M_local_buf + 8));
  pPVar3 = testing::
           WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::GetParam(&(this->super_DriverTest).
                       super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .
                       super_WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     );
  std::__cxx11::string::string(local_b0,(string *)pPVar3);
  type.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string(local_100,local_b0);
  bVar1 = arbiter::Arbiter::isLocal((undefined1 *)((long)&rawRoot.field_2 + 8),local_100);
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&stack0xffffffffffffff20,local_b0);
  }
  else {
    std::__cxx11::string::string(local_120,local_b0);
    type.field_2._M_local_buf[0xf] = '\x01';
    arbiter::stripProtocol(&stack0xffffffffffffff20,local_120);
  }
  if ((type.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::~string(local_120);
  }
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::string(local_168,(string *)&stack0xffffffffffffff20);
  arbiter::getProtocol(local_148,local_168);
  std::__cxx11::string::~string(local_168);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_148,"http");
  if ((bVar2) ||
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_148,"https"), bVar2)) {
    put.root.field_2._12_4_ = 1;
  }
  else {
    local_198 = (undefined1  [8])((long)&rawRoot.field_2 + 8);
    std::__cxx11::string::string((string *)&put,(string *)&stack0xffffffffffffff20);
    std::__cxx11::string::string(local_1b8,(string *)&stack0xffffffffffffff20);
    bVar1 = arbiter::Arbiter::isLocal((undefined1 *)((long)&rawRoot.field_2 + 8),local_1b8);
    std::__cxx11::string::~string(local_1b8);
    if ((bVar1 & 1) != 0) {
      std::operator+(&local_1d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff20,"a");
      arbiter::mkdirp(&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::operator+(&local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff20,"a/b");
      arbiter::mkdirp(&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_218,"one.txt",&local_219);
    TestBody::anon_class_40_2_d7075ad8::operator()((anon_class_40_2_d7075ad8 *)local_198,&local_218)
    ;
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_240,"two.txt",&local_241);
    TestBody::anon_class_40_2_d7075ad8::operator()((anon_class_40_2_d7075ad8 *)local_198,&local_240)
    ;
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_268,"a/one.txt",&local_269);
    TestBody::anon_class_40_2_d7075ad8::operator()((anon_class_40_2_d7075ad8 *)local_198,&local_268)
    ;
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_290,"a/two.txt",&local_291);
    TestBody::anon_class_40_2_d7075ad8::operator()((anon_class_40_2_d7075ad8 *)local_198,&local_290)
    ;
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2b8,"a/b/one.txt",&local_2b9);
    TestBody::anon_class_40_2_d7075ad8::operator()((anon_class_40_2_d7075ad8 *)local_198,&local_2b8)
    ;
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2e0,"a/b/two.txt",
               (allocator *)(resolve.root.field_2._M_local_buf + 0xf));
    TestBody::anon_class_40_2_d7075ad8::operator()((anon_class_40_2_d7075ad8 *)local_198,&local_2e0)
    ;
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)(resolve.root.field_2._M_local_buf + 0xf));
    check.root = (string *)((long)&rawRoot.field_2 + 8);
    std::__cxx11::string::string((string *)&resolve,(string *)&stack0xffffffffffffff20);
    local_320 = (undefined1  [8])&check.root;
    check.resolve = (anon_class_40_2_d7075ad8 *)&stack0xffffffffffffff20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_340,"*",&local_341);
    local_3d3 = 1;
    local_3d0 = &local_3c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3c8,"one.txt",&local_3d1);
    local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3a8,"two.txt",&local_3d2);
    local_3d3 = 0;
    local_388 = &local_3c8;
    local_380 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_3d5);
    __l_07._M_len = local_380;
    __l_07._M_array = local_388;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&local_378,__l_07,&local_3d4,&local_3d5);
    TestBody::anon_class_16_2_6acbd76d::operator()
              ((anon_class_16_2_6acbd76d *)local_320,&local_340,&local_378);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_378);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_3d5);
    local_a80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388;
    do {
      local_a80 = local_a80 + -1;
      std::__cxx11::string::~string((string *)local_a80);
    } while (local_a80 != &local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d2);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator((allocator<char> *)&local_341);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f8,"a/*",&local_3f9);
    local_48b = 1;
    local_488 = &local_480;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_480,"a/one.txt",&local_489);
    local_488 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_460,"a/two.txt",&local_48a);
    local_48b = 0;
    local_440 = &local_480;
    local_438 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_48d);
    __l_06._M_len = local_438;
    __l_06._M_array = local_440;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&local_430,__l_06,&local_48c,&local_48d);
    TestBody::anon_class_16_2_6acbd76d::operator()
              ((anon_class_16_2_6acbd76d *)local_320,&local_3f8,&local_430);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_430);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_48d);
    local_ac8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_440;
    do {
      local_ac8 = local_ac8 + -1;
      std::__cxx11::string::~string((string *)local_ac8);
    } while (local_ac8 != &local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_48a);
    std::allocator<char>::~allocator((allocator<char> *)&local_489);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4b0,"a/b/*",&local_4b1);
    local_543 = 1;
    local_540 = &local_538;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_538,"a/b/one.txt",&local_541);
    local_540 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_518,"a/b/two.txt",&local_542);
    local_543 = 0;
    local_4f8 = &local_538;
    local_4f0 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_545);
    __l_05._M_len = local_4f0;
    __l_05._M_array = local_4f8;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&local_4e8,__l_05,&local_544,&local_545);
    TestBody::anon_class_16_2_6acbd76d::operator()
              ((anon_class_16_2_6acbd76d *)local_320,&local_4b0,&local_4e8);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_4e8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_545);
    local_b10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4f8;
    do {
      local_b10 = local_b10 + -1;
      std::__cxx11::string::~string((string *)local_b10);
    } while (local_b10 != &local_538);
    std::allocator<char>::~allocator((allocator<char> *)&local_542);
    std::allocator<char>::~allocator((allocator<char> *)&local_541);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_568,"**",&local_569);
    local_67f = 1;
    local_678 = &local_670;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_670,"one.txt",&local_679);
    local_678 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_650;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_650,"two.txt",&local_67a);
    local_678 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_630,"a/one.txt",&local_67b);
    local_678 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_610,"a/two.txt",&local_67c);
    local_678 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5f0,"a/b/one.txt",&local_67d);
    local_678 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5d0,"a/b/two.txt",&local_67e);
    local_67f = 0;
    local_5b0 = &local_670;
    local_5a8 = 6;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_681);
    __l_04._M_len = local_5a8;
    __l_04._M_array = local_5b0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&local_5a0,__l_04,&local_680,&local_681);
    TestBody::anon_class_16_2_6acbd76d::operator()
              ((anon_class_16_2_6acbd76d *)local_320,&local_568,&local_5a0);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_5a0);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_681);
    local_b98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5b0;
    do {
      local_b98 = local_b98 + -1;
      std::__cxx11::string::~string((string *)local_b98);
    } while (local_b98 != &local_670);
    std::allocator<char>::~allocator((allocator<char> *)&local_67e);
    std::allocator<char>::~allocator((allocator<char> *)&local_67d);
    std::allocator<char>::~allocator((allocator<char> *)&local_67c);
    std::allocator<char>::~allocator((allocator<char> *)&local_67b);
    std::allocator<char>::~allocator((allocator<char> *)&local_67a);
    std::allocator<char>::~allocator((allocator<char> *)&local_679);
    std::__cxx11::string::~string((string *)&local_568);
    std::allocator<char>::~allocator((allocator<char> *)&local_569);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6a8,"a/**",&local_6a9);
    local_77d = 1;
    local_778 = &local_770;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_770,"a/one.txt",&local_779);
    local_778 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_750;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_750,"a/two.txt",&local_77a);
    local_778 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_730;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_730,"a/b/one.txt",&local_77b);
    local_778 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_710;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_710,"a/b/two.txt",&local_77c);
    local_77d = 0;
    local_6f0 = &local_770;
    local_6e8 = 4;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_77f);
    __l_03._M_len = local_6e8;
    __l_03._M_array = local_6f0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&local_6e0,__l_03,&local_77e,&local_77f);
    TestBody::anon_class_16_2_6acbd76d::operator()
              ((anon_class_16_2_6acbd76d *)local_320,&local_6a8,&local_6e0);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_6e0);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_77f);
    local_c00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6f0;
    do {
      local_c00 = local_c00 + -1;
      std::__cxx11::string::~string((string *)local_c00);
    } while (local_c00 != &local_770);
    std::allocator<char>::~allocator((allocator<char> *)&local_77c);
    std::allocator<char>::~allocator((allocator<char> *)&local_77b);
    std::allocator<char>::~allocator((allocator<char> *)&local_77a);
    std::allocator<char>::~allocator((allocator<char> *)&local_779);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7a0,"a/b/**",&local_7a1);
    local_833 = 1;
    local_830 = &local_828;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_828,"a/b/one.txt",&local_831);
    local_830 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_808;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_808,"a/b/two.txt",&local_832);
    local_833 = 0;
    local_7e8 = &local_828;
    local_7e0 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_835);
    __l_02._M_len = local_7e0;
    __l_02._M_array = local_7e8;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&local_7d8,__l_02,&local_834,&local_835);
    TestBody::anon_class_16_2_6acbd76d::operator()
              ((anon_class_16_2_6acbd76d *)local_320,&local_7a0,&local_7d8);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_7d8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_835);
    local_c48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_7e8;
    do {
      local_c48 = local_c48 + -1;
      std::__cxx11::string::~string((string *)local_c48);
    } while (local_c48 != &local_828);
    std::allocator<char>::~allocator((allocator<char> *)&local_832);
    std::allocator<char>::~allocator((allocator<char> *)&local_831);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_858,"",&local_859);
    local_8ca = 1;
    local_8c8 = &local_8c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8c0,"",&local_8c9);
    local_8ca = 0;
    local_8a0 = &local_8c0;
    local_898 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_8cc);
    __l_01._M_len = local_898;
    __l_01._M_array = local_8a0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&local_890,__l_01,&local_8cb,&local_8cc);
    TestBody::anon_class_16_2_6acbd76d::operator()
              ((anon_class_16_2_6acbd76d *)local_320,&local_858,&local_890);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_890);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_8cc);
    local_c80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8a0;
    do {
      local_c80 = local_c80 + -1;
      std::__cxx11::string::~string((string *)local_c80);
    } while (local_c80 != &local_8c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
    std::__cxx11::string::~string((string *)&local_858);
    std::allocator<char>::~allocator((allocator<char> *)&local_859);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8f0,"asdf",&local_8f1);
    local_962 = 1;
    local_960 = &local_958;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_958,"asdf",&local_961);
    local_962 = 0;
    local_938 = &local_958;
    local_930 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_964);
    __l_00._M_len = local_930;
    __l_00._M_array = local_938;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&local_928,__l_00,&local_963,&local_964);
    TestBody::anon_class_16_2_6acbd76d::operator()
              ((anon_class_16_2_6acbd76d *)local_320,&local_8f0,&local_928);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_928);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_964);
    local_cb8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_938;
    do {
      local_cb8 = local_cb8 + -1;
      std::__cxx11::string::~string((string *)local_cb8);
    } while (local_cb8 != &local_958);
    std::allocator<char>::~allocator((allocator<char> *)&local_961);
    std::__cxx11::string::~string((string *)&local_8f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_988,"asdf.txt",&local_989);
    local_9fa = 1;
    local_9f8 = &local_9f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9f0,"asdf.txt",&local_9f9);
    local_9fa = 0;
    local_9d0 = &local_9f0;
    local_9c8 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_9fc);
    __l._M_len = local_9c8;
    __l._M_array = local_9d0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&local_9c0,__l,&local_9fb,&local_9fc);
    TestBody::anon_class_16_2_6acbd76d::operator()
              ((anon_class_16_2_6acbd76d *)local_320,&local_988,&local_9c0);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set(&local_9c0);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_9fc);
    local_cf0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_9d0;
    do {
      local_cf0 = local_cf0 + -1;
      std::__cxx11::string::~string((string *)local_cf0);
    } while (local_cf0 != &local_9f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9f9);
    std::__cxx11::string::~string((string *)&local_988);
    std::allocator<char>::~allocator((allocator<char> *)&local_989);
    TestBody()::$_2::~__2((__2 *)&check.root);
    TestBody()::$_0::~__0((__0 *)local_198);
    put.root.field_2._12_4_ = 0;
  }
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
  std::__cxx11::string::~string(local_b0);
  arbiter::Arbiter::~Arbiter((Arbiter *)(rawRoot.field_2._M_local_buf + 8));
  return;
}

Assistant:

TEST_P(DriverTest, Glob)
{
    using Paths = std::set<std::string>;
    Arbiter a;

    const std::string rawRoot(GetParam());

    // Local directories explicitly prefixed with file:// will be returned
    // without that prefix, so strip that off.
    const std::string root(
            a.isLocal(rawRoot) ? stripProtocol(rawRoot) : rawRoot);
    const std::string type(getProtocol(root));

    // No `ls` for plain HTTP/s.
    if (type == "http" || type == "https") return;

    auto put([&a, root](std::string p)
    {
        EXPECT_NO_THROW(a.put(root + p, p));
    });

    if (a.isLocal(root))
    {
        mkdirp(root + "a");
        mkdirp(root + "a/b");
    }

    put("one.txt");
    put("two.txt");
    put("a/one.txt");
    put("a/two.txt");
    put("a/b/one.txt");
    put("a/b/two.txt");

    auto resolve([&a, root](std::string p)
    {
        const auto v = a.resolve(root + p);
        return Paths(v.begin(), v.end());
    });

    auto check([&](std::string p, Paths exp)
    {
        const auto got(resolve(p));
        EXPECT_GE(got.size(), exp.size());

        for (const auto& s : exp)
        {
            EXPECT_TRUE(got.count(root + s)) << p << ": " << root << s;
        }
    });

    // Non-recursive.
    check("*", Paths { "one.txt", "two.txt" });
    check("a/*", Paths { "a/one.txt", "a/two.txt" });
    check("a/b/*", Paths { "a/b/one.txt", "a/b/two.txt" });

    // Recursive.
    check("**", Paths {
            "one.txt", "two.txt",
            "a/one.txt", "a/two.txt",
            "a/b/one.txt", "a/b/two.txt"
        }
    );

    check("a/**", Paths {
            "a/one.txt", "a/two.txt",
            "a/b/one.txt", "a/b/two.txt"
        }
    );

    check("a/b/**", Paths { "a/b/one.txt", "a/b/two.txt" });

    // Not globs - files resolve to themselves.
    check("", Paths { "" });
    check("asdf", Paths { "asdf" });
    check("asdf.txt", Paths { "asdf.txt" });
}